

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::IsSimpleJitOriginalEntryPoint(FunctionBody *this)

{
  FunctionEntryPointInfo *this_00;
  JavascriptMethod p_Var1;
  JavascriptMethod p_Var2;
  bool bVar3;
  
  this_00 = FunctionProxy::
            GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                      ((FunctionProxy *)this);
  if (this_00 == (FunctionEntryPointInfo *)0x0) {
    bVar3 = false;
  }
  else {
    p_Var1 = EntryPointInfo::GetNativeEntrypoint(&this_00->super_EntryPointInfo);
    p_Var2 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    bVar3 = p_Var1 == p_Var2;
  }
  return bVar3;
}

Assistant:

bool FunctionBody::IsSimpleJitOriginalEntryPoint() const
    {
#if ENABLE_NATIVE_CODEGEN
        const FunctionEntryPointInfo *const simpleJitEntryPointInfo = GetSimpleJitEntryPointInfo();
        return simpleJitEntryPointInfo && simpleJitEntryPointInfo->GetNativeEntrypoint() == GetOriginalEntryPoint_Unchecked();
#else
        return false;
#endif
    }